

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

bool ActionMarkImplied::checkImpliedCover(Funcdata *data,Varnode *vn)

{
  bool bVar1;
  OpCode OVar2;
  int4 iVar3;
  PcodeOp *this;
  reference ppPVar4;
  uintb uVar5;
  uintb uVar6;
  Varnode *vn2;
  FuncCallSpecs *this_00;
  PcodeOp *pPVar7;
  Cover *pCVar8;
  Varnode *pVVar9;
  Merge *this_01;
  HighVariable *high;
  _List_const_iterator<PcodeOp_*> local_58;
  const_iterator iterend;
  const_iterator oiter;
  int4 i;
  Varnode *defvn;
  PcodeOp *callop;
  PcodeOp *storeop;
  PcodeOp *op;
  Varnode *vn_local;
  Funcdata *data_local;
  
  this = Varnode::getDef(vn);
  OVar2 = PcodeOp::code(this);
  if (OVar2 == CPUI_LOAD) {
    std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&iterend);
    std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_58);
    local_58._M_node = (_List_node_base *)Funcdata::endOp(data,CPUI_STORE);
    iterend = Funcdata::beginOp(data,CPUI_STORE);
    while (bVar1 = std::operator!=(&iterend,&local_58), bVar1) {
      ppPVar4 = std::_List_const_iterator<PcodeOp_*>::operator*(&iterend);
      pPVar7 = *ppPVar4;
      bVar1 = PcodeOp::isDead(pPVar7);
      if (!bVar1) {
        pCVar8 = Varnode::getCover(vn);
        bVar1 = Cover::contain(pCVar8,pPVar7,2);
        if (bVar1) {
          pVVar9 = PcodeOp::getIn(pPVar7,0);
          uVar5 = Varnode::getOffset(pVVar9);
          pVVar9 = PcodeOp::getIn(this,0);
          uVar6 = Varnode::getOffset(pVVar9);
          if (uVar5 == uVar6) {
            pVVar9 = PcodeOp::getIn(pPVar7,1);
            vn2 = PcodeOp::getIn(this,1);
            bVar1 = isPossibleAlias(pVVar9,vn2,2);
            if (bVar1) {
              return false;
            }
          }
        }
      }
      std::_List_const_iterator<PcodeOp_*>::operator++(&iterend);
    }
  }
  bVar1 = PcodeOp::isCall(this);
  if ((bVar1) || (OVar2 = PcodeOp::code(this), OVar2 == CPUI_LOAD)) {
    for (oiter._M_node._4_4_ = 0; iVar3 = Funcdata::numCalls(data), oiter._M_node._4_4_ < iVar3;
        oiter._M_node._4_4_ = oiter._M_node._4_4_ + 1) {
      this_00 = Funcdata::getCallSpecs(data,oiter._M_node._4_4_);
      pPVar7 = FuncCallSpecs::getOp(this_00);
      pCVar8 = Varnode::getCover(vn);
      bVar1 = Cover::contain(pCVar8,pPVar7,2);
      if (bVar1) {
        return false;
      }
    }
  }
  oiter._M_node._4_4_ = 0;
  do {
    iVar3 = PcodeOp::numInput(this);
    if (iVar3 <= oiter._M_node._4_4_) {
      return true;
    }
    pVVar9 = PcodeOp::getIn(this,oiter._M_node._4_4_);
    bVar1 = Varnode::isConstant(pVVar9);
    if (!bVar1) {
      this_01 = Funcdata::getMerge(data);
      high = Varnode::getHigh(vn);
      bVar1 = Merge::inflateTest(this_01,pVVar9,high);
      if (bVar1) {
        return false;
      }
    }
    oiter._M_node._4_4_ = oiter._M_node._4_4_ + 1;
  } while( true );
}

Assistant:

bool ActionMarkImplied::checkImpliedCover(Funcdata &data,Varnode *vn)

{
  PcodeOp *op,*storeop,*callop;
  Varnode *defvn;
  int4 i;

  op = vn->getDef();
  if (op->code() == CPUI_LOAD) { // Check for loads crossing stores
    list<PcodeOp *>::const_iterator oiter,iterend;
    iterend = data.endOp(CPUI_STORE);
    for(oiter=data.beginOp(CPUI_STORE);oiter!=iterend;++oiter) {
      storeop = *oiter;
      if (storeop->isDead()) continue;
      if (vn->getCover()->contain(storeop,2)) {
				// The LOAD crosses a STORE. We are cavalier
				// and let it through unless we can verify
				// that the pointers are actually the same
	if (storeop->getIn(0)->getOffset() == op->getIn(0)->getOffset()) {
	  //	  if (!functionalDifference(storeop->getIn(1),op->getIn(1),2)) return false;
	  if (isPossibleAlias(storeop->getIn(1),op->getIn(1),2)) return false;
	}
      }
    }
  }
  if (op->isCall() || (op->code() == CPUI_LOAD)) { // loads crossing calls
    for(i=0;i<data.numCalls();++i) {
      callop = data.getCallSpecs(i)->getOp();
      if (vn->getCover()->contain(callop,2)) return false;
    }
  }
  for(i=0;i<op->numInput();++i) {
    defvn = op->getIn(i);
    if (defvn->isConstant()) continue;
    if (data.getMerge().inflateTest(defvn,vn->getHigh()))	// Test for intersection
      return false;
  }
  return true;
}